

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase114::run(TestCase114 *this)

{
  uint *params_2;
  DestructionOrderRecorder *pDVar1;
  _func_int **pp_Var2;
  DestructionOrderRecorder *pDVar3;
  Disposer *pDVar4;
  DisposableOwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
  *this_00;
  void *in_RSI;
  DestructionOrderRecorder *ptrCopy;
  uint destroyed3;
  uint destroyed2;
  uint counter;
  uint destroyed1;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  uint local_68;
  uint local_64 [3];
  DebugComparison<unsigned_int_&,_int> local_58;
  
  local_64[1] = 0;
  params_2 = local_64 + 2;
  local_64[2] = 0;
  local_64[0] = 0;
  local_68 = 0;
  pDVar1 = (DestructionOrderRecorder *)operator_new(0x10);
  pDVar1->counter = local_64 + 1;
  pDVar1->recordTo = params_2;
  pp_Var2 = (_func_int **)operator_new(0x10);
  *pp_Var2 = (_func_int *)(local_64 + 1);
  pp_Var2[1] = (_func_int *)local_64;
  pDVar3 = (DestructionOrderRecorder *)operator_new(0x10);
  pDVar3->counter = local_64 + 1;
  pDVar3->recordTo = &local_68;
  pDVar4 = (Disposer *)operator_new(0x28);
  pDVar4[1]._vptr_Disposer =
       (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance
  ;
  pDVar4[2]._vptr_Disposer = pp_Var2;
  pDVar4[3]._vptr_Disposer =
       (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance
  ;
  pDVar4[4]._vptr_Disposer = (_func_int **)pDVar1;
  pDVar4->_vptr_Disposer = (_func_int **)&PTR_disposeImpl_00223628;
  this_00 = (DisposableOwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
             *)operator_new(0x28);
  (this_00->
  super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
  ).super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
  .first.disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  (this_00->
  super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
  ).super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
  .first.ptr = pDVar3;
  (this_00->
  super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
  ).first.disposer = pDVar4;
  (this_00->
  super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
  ).first.ptr = pDVar1;
  (this_00->super_Disposer)._vptr_Disposer = (_func_int **)&PTR_disposeImpl_00223628;
  _::
  DisposableOwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
  ::disposeImpl(this_00,in_RSI);
  local_58.result = local_64[2] == 1;
  local_58.right = 1;
  local_58.op.content.ptr = " == ";
  local_58.op.content.size_ = 5;
  if (_::Debug::minSeverity < 3 && !local_58.result) {
    local_58.left = params_2;
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x8b,ERROR,"\"failed: expected \" \"destroyed1 == 1\", _kjCondition, destroyed1",
               (char (*) [33])"failed: expected destroyed1 == 1",&local_58,params_2);
  }
  local_58.left = local_64;
  local_58.result = local_64[0] == 2;
  local_58.right = 2;
  local_58.op.content.ptr = " == ";
  local_58.op.content.size_ = 5;
  if (_::Debug::minSeverity < 3 && !local_58.result) {
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x8c,ERROR,"\"failed: expected \" \"destroyed2 == 2\", _kjCondition, destroyed2",
               (char (*) [33])"failed: expected destroyed2 == 2",&local_58,local_58.left);
  }
  local_58.result = local_68 == 3;
  local_58.left = &local_68;
  local_58.right = 3;
  local_58.op.content.ptr = " == ";
  local_58.op.content.size_ = 5;
  if ((!local_58.result) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x8d,ERROR,"\"failed: expected \" \"destroyed3 == 3\", _kjCondition, destroyed3",
               (char (*) [33])"failed: expected destroyed3 == 3",&local_58,local_58.left);
  }
  return;
}

Assistant:

TEST(Memory, AttachNested) {
  uint counter = 0;
  uint destroyed1 = 0;
  uint destroyed2 = 0;
  uint destroyed3 = 0;

  auto obj1 = kj::heap<DestructionOrderRecorder>(counter, destroyed1);
  auto obj2 = kj::heap<DestructionOrderRecorder>(counter, destroyed2);
  auto obj3 = kj::heap<DestructionOrderRecorder>(counter, destroyed3);

  auto ptr = obj1.get();

  Own<DestructionOrderRecorder> combined = obj1.attach(kj::mv(obj2)).attach(kj::mv(obj3));

  KJ_EXPECT(combined.get() == ptr);

  KJ_EXPECT(obj1.get() == nullptr);
  KJ_EXPECT(obj2.get() == nullptr);
  KJ_EXPECT(obj3.get() == nullptr);
  KJ_EXPECT(destroyed1 == 0);
  KJ_EXPECT(destroyed2 == 0);
  KJ_EXPECT(destroyed3 == 0);

  combined = nullptr;

  KJ_EXPECT(destroyed1 == 1, destroyed1);
  KJ_EXPECT(destroyed2 == 2, destroyed2);
  KJ_EXPECT(destroyed3 == 3, destroyed3);
}